

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

void p_hash_table_free(PHashTable *table)

{
  PHashTableNode *pPVar1;
  uint local_24;
  puint i;
  PHashTableNode *next_node;
  PHashTableNode *node;
  PHashTable *table_local;
  
  if (table != (PHashTable *)0x0) {
    for (local_24 = 0; (ulong)local_24 < table->size; local_24 = local_24 + 1) {
      next_node = table->table[local_24];
      while (next_node != (PHashTableNode *)0x0) {
        pPVar1 = next_node->next;
        p_free(next_node);
        next_node = pPVar1;
      }
    }
    p_free(table->table);
    p_free(table);
  }
  return;
}

Assistant:

P_LIB_API void
p_hash_table_free (PHashTable *table)
{
	PHashTableNode	*node;
	PHashTableNode	*next_node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; ) {
			next_node = node->next;
			p_free (node);
			node = next_node;
		}

	p_free (table->table);
	p_free (table);
}